

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O1

void __thiscall dbwrapper_tests::dbwrapper_basic_data::test_method(dbwrapper_basic_data *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  long lVar3;
  pointer puVar4;
  pointer puVar5;
  pointer pcVar6;
  byte bVar7;
  int iVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  uint64_t uVar11;
  long lVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char *pcVar14;
  FastRandomContext *this_00;
  ulong uVar15;
  iterator in_R8;
  iterator pvVar16;
  string *args_1;
  iterator in_R9;
  iterator pvVar17;
  long in_FS_OFFSET;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  const_string file;
  Span<std::byte> output;
  Span<std::byte> output_00;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  Span<std::byte> output_01;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<std::byte> output_02;
  Span<std::byte> output_03;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  Span<std::byte> output_04;
  Span<std::byte> output_05;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  Span<std::byte> output_06;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  check_type cVar21;
  undefined1 local_7b0 [16];
  undefined1 *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  bool in_file_bool;
  uint8_t filename_length;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  uint8_t key_lastblockhash_uxto;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  bool isInReindexing;
  uint8_t key_IsReindexing;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  uint32_t lastblockfilenumber;
  uint8_t key_last_blockfile_number;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  bool res_bool;
  uint32_t res_uint_32;
  bool *local_338;
  bool *local_330;
  string *local_328;
  char *local_320;
  assertion_result local_318;
  byte local_2fa [2];
  string key_file_option;
  string filename;
  string file_option_tag;
  uint256 lastblock_hash;
  uint256 in_utxo;
  string key_utxo;
  uint256 in_transaction;
  string key_transaction;
  uint256 in_file_info;
  string key_file;
  uint256 in_block;
  string key_block;
  uint256 res;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  size_t local_128;
  undefined2 local_120;
  bool local_11e;
  DBOptions local_11d;
  CDBWrapper dbw;
  path local_a8;
  path ph;
  uint256 ret;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_2fa[0] = 0;
  local_2fa[1] = 1;
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  lVar12 = 0;
  do {
    bVar2 = local_2fa[lVar12];
    ArgsManager::GetDataDir
              ((path *)&local_a8,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
    pcVar14 = "dbwrapper_1_obfuscate_false";
    if (bVar2 != 0) {
      pcVar14 = "dbwrapper_1_obfuscate_true";
    }
    std::filesystem::__cxx11::path::_M_append(&local_a8,bVar2 ^ 0x1b,pcVar14);
    std::filesystem::__cxx11::path::path(&ph.super_path,&local_a8);
    std::filesystem::__cxx11::path::~path(&local_a8);
    std::filesystem::__cxx11::path::path((path *)local_150,&ph.super_path);
    local_128 = 0x100000;
    local_120._0_1_ = false;
    local_120._1_1_ = true;
    local_11d.force_compact = false;
    local_11e = (bool)bVar2;
    CDBWrapper::CDBWrapper(&dbw,(DBParams *)local_150);
    std::filesystem::__cxx11::path::~path((path *)local_150);
    res.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_350 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_348 = "";
    local_360 = &boost::unit_test::basic_cstring<char_const>::null;
    local_358 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x3c;
    file.m_begin = (iterator)&local_350;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_360,msg);
    _cVar21 = 0x37b58d;
    pvVar9 = dbwrapper_private::GetObfuscateKey(&dbw);
    puVar4 = (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar7 = 1;
    if (puVar5 != puVar4) {
      uVar15 = 0;
      do {
        bVar7 = bVar7 & puVar4[uVar15] == '\0';
        uVar15 = uVar15 + 1;
      } while ((uVar15 & 0xffffffff) < (ulong)((long)puVar5 - (long)puVar4));
    }
    ret.super_base_blob<256U>.m_data._M_elems[0] = bVar2 != bVar7;
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_block._M_dataplus._M_p = "obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw))"
    ;
    key_block._M_string_length =
         (long)"obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw))" + 0x41;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &key_block;
    local_370 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_368 = "";
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_370,0x3c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output.m_size = 0x20;
    output.m_data = (byte *)&ret;
    FastRandomContext::fillrand(this_00,output);
    base_blob<256u>::ToString_abi_cxx11_((string *)local_150,(assertion_result *)&ret);
    paVar1 = &key_transaction.field_2;
    pvVar16 = (iterator)0x1;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150
                      ,0,0,"b",1);
    key_block._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
    paVar13 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_block._M_dataplus._M_p == paVar13) {
      key_block.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      key_block.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      key_block._M_dataplus._M_p = (pointer)&key_block.field_2;
    }
    else {
      key_block.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    key_block._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._0_8_ != &local_140) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_140._M_allocated_capacity + 1));
    }
    in_block.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_block.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output_00.m_size = 0x20;
    output_00.m_data = (byte *)&in_block;
    FastRandomContext::fillrand(this_00,output_00);
    local_380 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_378 = "";
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x42;
    file_00.m_begin = (iterator)&local_380;
    msg_00.m_end = pvVar17;
    msg_00.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_390,
               msg_00);
    _cVar21 = 0x37b7de;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Write<std::__cxx11::string,uint256>(&dbw,&key_block,&in_block,false);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_file._M_dataplus._M_p = "dbw.Write(key_block, in_block)";
    key_file._M_string_length = (long)"dbw.Write(key_block, in_block)" + 0x1e;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &key_file;
    local_3a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_398 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_3a0,0x42);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_3b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_3a8 = "";
    local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x43;
    file_01.m_begin = (iterator)&local_3b0;
    msg_01.m_end = pvVar17;
    msg_01.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3c0,
               msg_01);
    _cVar21 = 0x37b90b;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<std::__cxx11::string,uint256>(&dbw,&key_block,&res);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_file._M_dataplus._M_p = "dbw.Read(key_block, res)";
    key_file._M_string_length = (long)"dbw.Read(key_block, res)" + 0x18;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &key_file;
    local_3d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_3c8 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_3d0,0x43);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_3e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_3d8 = "";
    local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x44;
    file_02.m_begin = (iterator)&local_3e0;
    msg_02.m_end = pvVar17;
    msg_02.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3f0,
               msg_02);
    key_file._M_string_length = key_file._M_string_length & 0xffffffffffffff00;
    key_file._M_dataplus._M_p = "@;\x1f";
    key_file.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key_file.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    base_blob<256u>::ToString_abi_cxx11_((string *)&in_file_info,&res);
    base_blob<256u>::ToString_abi_cxx11_(&key_transaction,&in_block);
    if (in_file_info.super_base_blob<256U>.m_data._M_elems._8_8_ == key_transaction._M_string_length
       ) {
      if (in_file_info.super_base_blob<256U>.m_data._M_elems._8_8_ == 0) {
        in_transaction.super_base_blob<256U>.m_data._M_elems[0] = true;
      }
      else {
        iVar8 = bcmp((void *)in_file_info.super_base_blob<256U>.m_data._M_elems._0_8_,
                     key_transaction._M_dataplus._M_p,
                     in_file_info.super_base_blob<256U>.m_data._M_elems._8_8_);
        in_transaction.super_base_blob<256U>.m_data._M_elems[0] = iVar8 == 0;
      }
    }
    else {
      in_transaction.super_base_blob<256U>.m_data._M_elems[0] = false;
    }
    in_transaction.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_utxo._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    key_utxo._M_string_length =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
         + 0x68;
    in_utxo.super_base_blob<256U>.m_data._M_elems[0] = (uchar)&in_file_info;
    in_utxo.super_base_blob<256U>.m_data._M_elems._1_7_ = SUB87((ulong)&in_file_info >> 8,0);
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abbf0;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &in_utxo;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &key_transaction;
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = 0xf0;
    ret.super_base_blob<256U>.m_data._M_elems[1] = 0xbb;
    ret.super_base_blob<256U>.m_data._M_elems[2] = ':';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    ret.super_base_blob<256U>.m_data._M_elems._24_8_ = &lastblock_hash;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&in_transaction,(lazy_ostream *)&key_file,1,2,REQUIRE,0xe7f469,
               (size_t)&key_utxo,0x44,(DBParams *)local_150,"in_block.ToString()",&ret);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(in_transaction.super_base_blob<256U>.m_data._M_elems + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_transaction._M_dataplus._M_p != paVar1) {
      operator_delete(key_transaction._M_dataplus._M_p,
                      key_transaction.field_2._M_allocated_capacity + 1);
    }
    if ((uchar *)in_file_info.super_base_blob<256U>.m_data._M_elems._0_8_ !=
        in_file_info.super_base_blob<256U>.m_data._M_elems + 0x10) {
      operator_delete((void *)in_file_info.super_base_blob<256U>.m_data._M_elems._0_8_,
                      in_file_info.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
    }
    uVar11 = RandomMixin<FastRandomContext>::randbits<32>
                       (&this_00->super_RandomMixin<FastRandomContext>);
    local_150._0_4_ = (int)uVar11;
    tinyformat::format<unsigned_int>(&key_file,"f%04x",(uint *)local_150);
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_file_info.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output_01.m_size = 0x20;
    output_01.m_data = (byte *)&in_file_info;
    FastRandomContext::fillrand(this_00,output_01);
    local_400 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_3f8 = "";
    local_410 = &boost::unit_test::basic_cstring<char_const>::null;
    local_408 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x4a;
    file_03.m_begin = (iterator)&local_400;
    msg_03.m_end = pvVar17;
    msg_03.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_410,
               msg_03);
    _cVar21 = 0x37bcde;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Write<std::__cxx11::string,uint256>(&dbw,&key_file,&in_file_info,false);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_transaction._M_dataplus._M_p = "dbw.Write(key_file, in_file_info)";
    key_transaction._M_string_length = (long)"dbw.Write(key_file, in_file_info)" + 0x21;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &key_transaction;
    local_420 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_418 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_420,0x4a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_430 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_428 = "";
    local_440 = &boost::unit_test::basic_cstring<char_const>::null;
    local_438 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x4b;
    file_04.m_begin = (iterator)&local_430;
    msg_04.m_end = pvVar17;
    msg_04.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_440,
               msg_04);
    _cVar21 = 0x37be0b;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<std::__cxx11::string,uint256>(&dbw,&key_file,&res);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_transaction._M_dataplus._M_p = "dbw.Read(key_file, res)";
    key_transaction._M_string_length = (long)"dbw.Read(key_file, res)" + 0x17;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &key_transaction;
    local_450 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_448 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_450,0x4b);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_460 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_458 = "";
    local_470 = &boost::unit_test::basic_cstring<char_const>::null;
    local_468 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x4c;
    file_05.m_begin = (iterator)&local_460;
    msg_05.m_end = pvVar17;
    msg_05.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_470,
               msg_05);
    key_transaction._M_string_length = key_transaction._M_string_length & 0xffffffffffffff00;
    key_transaction._M_dataplus._M_p = "@;\x1f";
    key_transaction.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key_transaction.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    base_blob<256u>::ToString_abi_cxx11_((string *)&in_transaction,&res);
    base_blob<256u>::ToString_abi_cxx11_(&key_utxo,&in_file_info);
    if (in_transaction.super_base_blob<256U>.m_data._M_elems._8_8_ == key_utxo._M_string_length) {
      if (in_transaction.super_base_blob<256U>.m_data._M_elems._8_8_ == 0) {
        in_utxo.super_base_blob<256U>.m_data._M_elems[0] = true;
      }
      else {
        iVar8 = bcmp((void *)CONCAT71(in_transaction.super_base_blob<256U>.m_data._M_elems._1_7_,
                                      in_transaction.super_base_blob<256U>.m_data._M_elems[0]),
                     key_utxo._M_dataplus._M_p,
                     in_transaction.super_base_blob<256U>.m_data._M_elems._8_8_);
        in_utxo.super_base_blob<256U>.m_data._M_elems[0] = iVar8 == 0;
      }
    }
    else {
      in_utxo.super_base_blob<256U>.m_data._M_elems[0] = false;
    }
    in_utxo.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    file_option_tag._M_dataplus._M_p = (pointer)&in_transaction;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abbf0;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &file_option_tag;
    filename._M_dataplus._M_p = (pointer)&key_utxo;
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = 0xf0;
    ret.super_base_blob<256U>.m_data._M_elems[1] = 0xbb;
    ret.super_base_blob<256U>.m_data._M_elems[2] = ':';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    ret.super_base_blob<256U>.m_data._M_elems._24_8_ = &filename;
    pvVar16 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&in_utxo,(lazy_ostream *)&key_transaction,1,2,REQUIRE,0xe7f469,
               (size_t)&lastblock_hash,0x4c,(DBParams *)local_150,"in_file_info.ToString()",&ret);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(in_utxo.super_base_blob<256U>.m_data._M_elems + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_utxo._M_dataplus._M_p != &key_utxo.field_2) {
      operator_delete(key_utxo._M_dataplus._M_p,key_utxo.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)
        CONCAT71(in_transaction.super_base_blob<256U>.m_data._M_elems._1_7_,
                 in_transaction.super_base_blob<256U>.m_data._M_elems[0]) !=
        in_transaction.super_base_blob<256U>.m_data._M_elems + 0x10) {
      operator_delete((undefined1 *)
                      CONCAT71(in_transaction.super_base_blob<256U>.m_data._M_elems._1_7_,
                               in_transaction.super_base_blob<256U>.m_data._M_elems[0]),
                      in_transaction.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
    }
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output_02.m_size = 0x20;
    output_02.m_data = (byte *)&ret;
    FastRandomContext::fillrand(this_00,output_02);
    base_blob<256u>::ToString_abi_cxx11_((string *)local_150,&ret);
    pvVar17 = (iterator)0x1;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150
                      ,0,0,"t",1);
    key_transaction._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
    paVar13 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_transaction._M_dataplus._M_p == paVar13) {
      key_transaction.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      key_transaction.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      key_transaction._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      key_transaction.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    key_transaction._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._0_8_ != &local_140) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_140._M_allocated_capacity + 1));
    }
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_transaction.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output_03.m_size = 0x20;
    output_03.m_data = (byte *)&in_transaction;
    FastRandomContext::fillrand(this_00,output_03);
    local_480 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_478 = "";
    local_490 = &boost::unit_test::basic_cstring<char_const>::null;
    local_488 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x52;
    file_06.m_begin = (iterator)&local_480;
    msg_06.m_end = pvVar16;
    msg_06.m_begin = pvVar17;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_490,
               msg_06);
    _cVar21 = 0x37c272;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Write<std::__cxx11::string,uint256>
                   (&dbw,&key_transaction,&in_transaction,false);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_utxo._M_dataplus._M_p = "dbw.Write(key_transaction, in_transaction)";
    key_utxo._M_string_length = (long)"dbw.Write(key_transaction, in_transaction)" + 0x2a;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &key_utxo;
    local_4a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_498 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_4a0,0x52);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_4b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_4a8 = "";
    local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x53;
    file_07.m_begin = (iterator)&local_4b0;
    msg_07.m_end = pvVar17;
    msg_07.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4c0,
               msg_07);
    _cVar21 = 0x37c39f;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<std::__cxx11::string,uint256>(&dbw,&key_transaction,&res);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key_utxo._M_dataplus._M_p = "dbw.Read(key_transaction, res)";
    key_utxo._M_string_length = (long)"dbw.Read(key_transaction, res)" + 0x1e;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &key_utxo;
    local_4d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_4c8 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_4d0,0x53);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_4e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_4d8 = "";
    local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x54;
    file_08.m_begin = (iterator)&local_4e0;
    msg_08.m_end = pvVar17;
    msg_08.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4f0,
               msg_08);
    key_utxo._M_string_length = key_utxo._M_string_length & 0xffffffffffffff00;
    key_utxo._M_dataplus._M_p = "@;\x1f";
    key_utxo.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key_utxo.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    base_blob<256u>::ToString_abi_cxx11_((string *)&in_utxo,&res);
    base_blob<256u>::ToString_abi_cxx11_((string *)&lastblock_hash,&in_transaction);
    if (in_utxo.super_base_blob<256U>.m_data._M_elems._8_8_ ==
        lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_) {
      if (in_utxo.super_base_blob<256U>.m_data._M_elems._8_8_ == 0) {
        bVar18 = true;
      }
      else {
        iVar8 = bcmp((void *)CONCAT71(in_utxo.super_base_blob<256U>.m_data._M_elems._1_7_,
                                      in_utxo.super_base_blob<256U>.m_data._M_elems[0]),
                     (void *)lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                     in_utxo.super_base_blob<256U>.m_data._M_elems._8_8_);
        bVar18 = iVar8 == 0;
      }
    }
    else {
      bVar18 = false;
    }
    file_option_tag._M_dataplus._M_p._0_1_ = bVar18;
    file_option_tag._8_16_ = (undefined1  [16])0x0;
    filename._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    filename._M_string_length = (size_type)"";
    key_file_option._M_dataplus._M_p = (pointer)&in_utxo;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abbf0;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &key_file_option;
    local_7b0._0_8_ = &lastblock_hash;
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = 0xf0;
    ret.super_base_blob<256U>.m_data._M_elems[1] = 0xbb;
    ret.super_base_blob<256U>.m_data._M_elems[2] = ':';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    ret.super_base_blob<256U>.m_data._M_elems._24_8_ = local_7b0;
    pvVar16 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&file_option_tag,(lazy_ostream *)&key_utxo,1,2,REQUIRE,0xe7f469,
               (size_t)&filename,0x54,(DBParams *)local_150,"in_transaction.ToString()",&ret);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&file_option_tag.field_2._M_allocated_capacity);
    if ((uchar *)lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
        lastblock_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
      operator_delete((void *)lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                      lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
    }
    if ((undefined1 *)
        CONCAT71(in_utxo.super_base_blob<256U>.m_data._M_elems._1_7_,
                 in_utxo.super_base_blob<256U>.m_data._M_elems[0]) !=
        in_utxo.super_base_blob<256U>.m_data._M_elems + 0x10) {
      operator_delete((undefined1 *)
                      CONCAT71(in_utxo.super_base_blob<256U>.m_data._M_elems._1_7_,
                               in_utxo.super_base_blob<256U>.m_data._M_elems[0]),
                      in_utxo.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
    }
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output_04.m_size = 0x20;
    output_04.m_data = (byte *)&ret;
    FastRandomContext::fillrand(this_00,output_04);
    base_blob<256u>::ToString_abi_cxx11_((string *)local_150,&ret);
    pvVar17 = (iterator)0x1;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150
                      ,0,0,"c",1);
    key_utxo._M_dataplus._M_p = (pointer)&key_utxo.field_2;
    pcVar6 = (pbVar10->_M_dataplus)._M_p;
    paVar13 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 == paVar13) {
      key_utxo.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      key_utxo.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
    }
    else {
      key_utxo.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      key_utxo._M_dataplus._M_p = pcVar6;
    }
    key_utxo._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._0_8_ != &local_140) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_140._M_allocated_capacity + 1));
    }
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in_utxo.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output_05.m_size = 0x20;
    output_05.m_data = (byte *)&in_utxo;
    FastRandomContext::fillrand(this_00,output_05);
    local_500 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_4f8 = "";
    local_510 = &boost::unit_test::basic_cstring<char_const>::null;
    local_508 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x5a;
    file_09.m_begin = (iterator)&local_500;
    msg_09.m_end = pvVar16;
    msg_09.m_begin = pvVar17;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_510,
               msg_09);
    _cVar21 = 0x37c7ff;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Write<std::__cxx11::string,uint256>(&dbw,&key_utxo,&in_utxo,false);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_841efe;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"dbw.Write(key_utxo, in_utxo)" + 0x1c;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &lastblock_hash;
    local_520 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_518 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_520,0x5a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_530 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_528 = "";
    local_540 = &boost::unit_test::basic_cstring<char_const>::null;
    local_538 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x5b;
    file_10.m_begin = (iterator)&local_530;
    msg_10.m_end = pvVar17;
    msg_10.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_540,
               msg_10);
    _cVar21 = 0x37c92c;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<std::__cxx11::string,uint256>(&dbw,&key_utxo,&res);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = "dbw.Read(key_utxo, res)";
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &lastblock_hash;
    local_550 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_548 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_550,0x5b);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_560 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_558 = "";
    local_570 = &boost::unit_test::basic_cstring<char_const>::null;
    local_568 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x5c;
    file_11.m_begin = (iterator)&local_560;
    msg_11.m_end = pvVar17;
    msg_11.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_570,
               msg_11);
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = "";
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    base_blob<256u>::ToString_abi_cxx11_(&file_option_tag,&res);
    base_blob<256u>::ToString_abi_cxx11_(&filename,&in_utxo);
    if (file_option_tag._M_string_length == filename._M_string_length) {
      if (file_option_tag._M_string_length == 0) {
        bVar18 = true;
      }
      else {
        iVar8 = bcmp(file_option_tag._M_dataplus._M_p,filename._M_dataplus._M_p,
                     file_option_tag._M_string_length);
        bVar18 = iVar8 == 0;
      }
    }
    else {
      bVar18 = false;
    }
    key_file_option._M_dataplus._M_p._0_1_ = bVar18;
    key_file_option._8_16_ = (undefined1  [16])0x0;
    local_7b0._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_7b0._8_8_ = "";
    local_318._0_8_ = &file_option_tag;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abbf0;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &local_318;
    local_328 = &filename;
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = 0xf0;
    ret.super_base_blob<256U>.m_data._M_elems[1] = 0xbb;
    ret.super_base_blob<256U>.m_data._M_elems[2] = ':';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    ret.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_328;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&key_file_option,(lazy_ostream *)&lastblock_hash,1,2,REQUIRE,
               0xe7f469,(size_t)local_7b0,0x5c,(DBParams *)local_150,"in_utxo.ToString()",&ret);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&key_file_option.field_2._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p != &filename.field_2) {
      operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)file_option_tag._M_dataplus._M_p != &file_option_tag.field_2) {
      operator_delete(file_option_tag._M_dataplus._M_p,
                      file_option_tag.field_2._M_allocated_capacity + 1);
    }
    key_last_blockfile_number = 'l';
    uVar11 = RandomMixin<FastRandomContext>::randbits<32>
                       (&this_00->super_RandomMixin<FastRandomContext>);
    lastblockfilenumber = (uint32_t)uVar11;
    local_588 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_580 = "";
    local_598 = &boost::unit_test::basic_cstring<char_const>::null;
    local_590 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x61;
    file_12.m_begin = (iterator)&local_588;
    msg_12.m_end = pvVar17;
    msg_12.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_598,
               msg_12);
    _cVar21 = 0x37ccb9;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Write<unsigned_char,unsigned_int>
                   (&dbw,&key_last_blockfile_number,&lastblockfilenumber,false);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_841f2d;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"dbw.Write(key_last_blockfile_number, lastblockfilenumber)" + 0x39;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &lastblock_hash;
    local_5a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_5a0 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_5a8,0x61);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_5b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_5b0 = "";
    local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x62;
    file_13.m_begin = (iterator)&local_5b8;
    msg_13.m_end = pvVar17;
    msg_13.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5c8,
               msg_13);
    _cVar21 = 0x37cde6;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<unsigned_char,unsigned_int>(&dbw,&key_last_blockfile_number,&res_uint_32);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         "dbw.Read(key_last_blockfile_number, res_uint_32)";
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &lastblock_hash;
    local_5d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_5d0 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_5d8,0x62);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_5e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_5e0 = "";
    local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x63;
    file_14.m_begin = (iterator)&local_5e8;
    msg_14.m_end = pvVar17;
    msg_14.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5f8,
               msg_14);
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    file_option_tag._M_dataplus._M_p._0_1_ = lastblockfilenumber == res_uint_32;
    file_option_tag._8_16_ = (undefined1  [16])0x0;
    filename._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    filename._M_string_length =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
         + 0x68;
    key_file_option._M_dataplus._M_p = (pointer)&lastblockfilenumber;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abbb0;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &key_file_option;
    local_7b0._0_8_ = &res_uint_32;
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = 0xb0;
    ret.super_base_blob<256U>.m_data._M_elems[1] = 0xbb;
    ret.super_base_blob<256U>.m_data._M_elems[2] = ':';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    ret.super_base_blob<256U>.m_data._M_elems._24_8_ = local_7b0;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&file_option_tag,(lazy_ostream *)&lastblock_hash,1,2,REQUIRE,
               0xe7f1bf,(size_t)&filename,99,(DBParams *)local_150,"res_uint_32",&ret);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&file_option_tag.field_2._M_allocated_capacity);
    key_IsReindexing = 'R';
    uVar11 = RandomMixin<FastRandomContext>::randbits<1>
                       (&this_00->super_RandomMixin<FastRandomContext>);
    isInReindexing = uVar11 != 0;
    local_610 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_608 = "";
    local_620 = &boost::unit_test::basic_cstring<char_const>::null;
    local_618 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = &DAT_00000068;
    file_15.m_begin = (iterator)&local_610;
    msg_15.m_end = pvVar17;
    msg_15.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_620,
               msg_15);
    _cVar21 = 0x37d0c0;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Write<unsigned_char,bool>(&dbw,&key_IsReindexing,&isInReindexing,false);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_841f83;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"dbw.Write(key_IsReindexing, isInReindexing)" + 0x2b;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &lastblock_hash;
    local_630 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_628 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_630,0x68);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_640 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_638 = "";
    local_650 = &boost::unit_test::basic_cstring<char_const>::null;
    local_648 = &boost::unit_test::basic_cstring<char_const>::null;
    file_16.m_end = (iterator)0x69;
    file_16.m_begin = (iterator)&local_640;
    msg_16.m_end = pvVar17;
    msg_16.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_650,
               msg_16);
    _cVar21 = 0x37d1ed;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<unsigned_char,bool>(&dbw,&key_IsReindexing,&res_bool);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         "dbw.Read(key_IsReindexing, res_bool)";
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &lastblock_hash;
    local_660 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_658 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_660,0x69);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_670 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_668 = "";
    local_680 = &boost::unit_test::basic_cstring<char_const>::null;
    local_678 = &boost::unit_test::basic_cstring<char_const>::null;
    file_17.m_end = (iterator)0x6a;
    file_17.m_begin = (iterator)&local_670;
    msg_17.m_end = pvVar17;
    msg_17.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_680,
               msg_17);
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013abb30;
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = "";
    lastblock_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    file_option_tag._M_dataplus._M_p._0_1_ = isInReindexing == res_bool;
    file_option_tag._8_16_ = (undefined1  [16])0x0;
    filename._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    filename._M_string_length = (size_type)"";
    key_file_option._M_dataplus._M_p = &isInReindexing;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abe90;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &key_file_option;
    local_7b0._0_8_ = &res_bool;
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = 0x90;
    ret.super_base_blob<256U>.m_data._M_elems[1] = 0xbe;
    ret.super_base_blob<256U>.m_data._M_elems[2] = ':';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    ret.super_base_blob<256U>.m_data._M_elems._24_8_ = local_7b0;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&file_option_tag,(lazy_ostream *)&lastblock_hash,1,2,REQUIRE,
               0xe7f230,(size_t)&filename,0x6a,(DBParams *)local_150,"res_bool",&ret);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&file_option_tag.field_2._M_allocated_capacity);
    key_lastblockhash_uxto = 'B';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    lastblock_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output_06.m_size = 0x20;
    output_06.m_data = (byte *)&lastblock_hash;
    FastRandomContext::fillrand(this_00,output_06);
    local_698 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_690 = "";
    local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_18.m_end = (iterator)0x6f;
    file_18.m_begin = (iterator)&local_698;
    msg_18.m_end = pvVar17;
    msg_18.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_6a8,
               msg_18);
    _cVar21 = 0x37d4e5;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Write<unsigned_char,uint256>
                   (&dbw,&key_lastblockhash_uxto,&lastblock_hash,false);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    file_option_tag._M_dataplus._M_p = "dbw.Write(key_lastblockhash_uxto, lastblock_hash)";
    file_option_tag._M_string_length =
         (long)"dbw.Write(key_lastblockhash_uxto, lastblock_hash)" + 0x31;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &file_option_tag;
    local_6b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_6b0 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_6b8,0x6f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_6c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_6c0 = "";
    local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_19.m_end = (iterator)0x70;
    file_19.m_begin = (iterator)&local_6c8;
    msg_19.m_end = pvVar17;
    msg_19.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_6d8,
               msg_19);
    _cVar21 = 0x37d612;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<unsigned_char,uint256>(&dbw,&key_lastblockhash_uxto,&res);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    file_option_tag._M_dataplus._M_p = "dbw.Read(key_lastblockhash_uxto, res)";
    file_option_tag._M_string_length = (size_type)"";
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &file_option_tag;
    local_6e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_6e0 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_6e8,0x70);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_6f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_6f0 = "";
    local_708 = &boost::unit_test::basic_cstring<char_const>::null;
    local_700 = &boost::unit_test::basic_cstring<char_const>::null;
    file_20.m_end = (iterator)0x71;
    file_20.m_begin = (iterator)&local_6f8;
    msg_20.m_end = pvVar17;
    msg_20.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_708,
               msg_20);
    file_option_tag._M_string_length = file_option_tag._9_8_ << 8;
    file_option_tag._M_dataplus._M_p = "@;\x1f";
    file_option_tag.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    auVar20[0] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x10] ==
                  res.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar20[1] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x11] ==
                  res.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar20[2] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x12] ==
                  res.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar20[3] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x13] ==
                  res.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar20[4] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x14] ==
                  res.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar20[5] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x15] ==
                  res.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar20[6] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x16] ==
                  res.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar20[7] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x17] ==
                  res.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar20[8] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x18] ==
                  res.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar20[9] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x19] ==
                  res.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar20[10] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                   res.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar20[0xb] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                    res.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar20[0xc] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                    res.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar20[0xd] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                    res.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar20[0xe] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                    res.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar20[0xf] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                    res.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar19[0] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                  res.super_base_blob<256U>.m_data._M_elems[0]);
    auVar19[1] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                  res.super_base_blob<256U>.m_data._M_elems[1]);
    auVar19[2] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                  res.super_base_blob<256U>.m_data._M_elems[2]);
    auVar19[3] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                  res.super_base_blob<256U>.m_data._M_elems[3]);
    auVar19[4] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                  res.super_base_blob<256U>.m_data._M_elems[4]);
    auVar19[5] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                  res.super_base_blob<256U>.m_data._M_elems[5]);
    auVar19[6] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                  res.super_base_blob<256U>.m_data._M_elems[6]);
    auVar19[7] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                  res.super_base_blob<256U>.m_data._M_elems[7]);
    auVar19[8] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                  res.super_base_blob<256U>.m_data._M_elems[8]);
    auVar19[9] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                  res.super_base_blob<256U>.m_data._M_elems[9]);
    auVar19[10] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                   res.super_base_blob<256U>.m_data._M_elems[10]);
    auVar19[0xb] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                    res.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar19[0xc] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                    res.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar19[0xd] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                    res.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar19[0xe] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                    res.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar19[0xf] = -(lastblock_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                    res.super_base_blob<256U>.m_data._M_elems[0xf]);
    file_option_tag.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    auVar19 = auVar19 & auVar20;
    filename._M_dataplus._M_p._0_1_ =
         (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff;
    filename._8_16_ = (undefined1  [16])0x0;
    key_file_option._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    key_file_option._M_string_length = (size_type)"";
    local_7b0._0_8_ = &lastblock_hash;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013ac618;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = local_7b0;
    local_318._0_8_ = &res;
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = '\x18';
    ret.super_base_blob<256U>.m_data._M_elems[1] = 0xc6;
    ret.super_base_blob<256U>.m_data._M_elems[2] = ':';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    ret.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_318;
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&filename,(lazy_ostream *)&file_option_tag,1,2,REQUIRE,0xe7f2a0,
               (size_t)&key_file_option,0x71,(DBParams *)local_150,"res",&ret);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&filename.field_2._M_allocated_capacity);
    file_option_tag._M_dataplus._M_p = (pointer)&file_option_tag.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&file_option_tag,"F","");
    uVar11 = RandomMixin<FastRandomContext>::randbits
                       (&this_00->super_RandomMixin<FastRandomContext>,8);
    filename_length = (uint8_t)uVar11;
    args_1 = &filename;
    filename._M_dataplus._M_p = (pointer)&filename.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)args_1,"randomfilename","");
    tinyformat::format<std::__cxx11::string,unsigned_char,std::__cxx11::string>
              (&key_file_option,(tinyformat *)"%s%01x%s",(char *)&file_option_tag,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filename_length
               ,(uchar *)args_1,pbVar10);
    uVar11 = RandomMixin<FastRandomContext>::randbits<1>
                       (&this_00->super_RandomMixin<FastRandomContext>);
    in_file_bool = uVar11 != 0;
    local_720 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_718 = "";
    local_730 = &boost::unit_test::basic_cstring<char_const>::null;
    local_728 = &boost::unit_test::basic_cstring<char_const>::null;
    file_21.m_end = (iterator)0x7a;
    file_21.m_begin = (iterator)&local_720;
    msg_21.m_end = (iterator)pbVar10;
    msg_21.m_begin = (iterator)args_1;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_730,
               msg_21);
    _cVar21 = 0x37d9b2;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Write<std::__cxx11::string,bool>(&dbw,&key_file_option,&in_file_bool,false);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_7b0._0_8_ = "dbw.Write(key_file_option, in_file_bool)";
    local_7b0._8_8_ = "";
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = local_7b0;
    local_740 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_738 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_740,0x7a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_750 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_748 = "";
    local_760 = &boost::unit_test::basic_cstring<char_const>::null;
    local_758 = &boost::unit_test::basic_cstring<char_const>::null;
    file_22.m_end = (iterator)0x7b;
    file_22.m_begin = (iterator)&local_750;
    msg_22.m_end = pvVar17;
    msg_22.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_760,
               msg_22);
    _cVar21 = 0x37dad0;
    ret.super_base_blob<256U>.m_data._M_elems[0] =
         CDBWrapper::Read<std::__cxx11::string,bool>(&dbw,&key_file_option,&res_bool);
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_7b0._0_8_ = "dbw.Read(key_file_option, res_bool)";
    local_7b0._8_8_ = "";
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abc70;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = local_7b0;
    local_770 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_768 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ret,(lazy_ostream *)local_150,1,0,WARN,_cVar21,
               (size_t)&local_770,0x7b);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(ret.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_780 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_778 = "";
    local_790 = &boost::unit_test::basic_cstring<char_const>::null;
    local_788 = &boost::unit_test::basic_cstring<char_const>::null;
    file_23.m_end = (iterator)0x7c;
    file_23.m_begin = (iterator)&local_780;
    msg_23.m_end = pvVar17;
    msg_23.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_790,
               msg_23);
    local_7b0._8_8_ = local_7b0._8_8_ & 0xffffffffffffff00;
    local_7b0._0_8_ = &PTR__lazy_ostream_013abb30;
    local_7a0 = boost::unit_test::lazy_ostream::inst;
    local_798 = "";
    local_318.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(res_bool == in_file_bool);
    local_318.m_message.px = (element_type *)0x0;
    local_318.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_328 = (string *)0xe7ee9c;
    local_320 = "";
    local_330 = &res_bool;
    local_150[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_013abe90;
    local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_140._8_8_ = &local_330;
    local_338 = &in_file_bool;
    ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[0] = 0x90;
    ret.super_base_blob<256U>.m_data._M_elems[1] = 0xbe;
    ret.super_base_blob<256U>.m_data._M_elems[2] = ':';
    ret.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
    ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    ret.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    ret.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_338;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_318,(lazy_ostream *)local_7b0,1,2,REQUIRE,0xe7f23f,(size_t)&local_328,0x7c,
               (DBParams *)local_150,"in_file_bool",&ret);
    boost::detail::shared_count::~shared_count(&local_318.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_file_option._M_dataplus._M_p != &key_file_option.field_2) {
      operator_delete(key_file_option._M_dataplus._M_p,
                      key_file_option.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p != &filename.field_2) {
      operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)file_option_tag._M_dataplus._M_p != &file_option_tag.field_2) {
      operator_delete(file_option_tag._M_dataplus._M_p,
                      file_option_tag.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_utxo._M_dataplus._M_p != &key_utxo.field_2) {
      operator_delete(key_utxo._M_dataplus._M_p,key_utxo.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_transaction._M_dataplus._M_p != paVar1) {
      operator_delete(key_transaction._M_dataplus._M_p,
                      key_transaction.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_file._M_dataplus._M_p != &key_file.field_2) {
      operator_delete(key_file._M_dataplus._M_p,key_file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_block._M_dataplus._M_p != &key_block.field_2) {
      operator_delete(key_block._M_dataplus._M_p,key_block.field_2._M_allocated_capacity + 1);
    }
    CDBWrapper::~CDBWrapper(&dbw);
    std::filesystem::__cxx11::path::~path(&ph.super_path);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(dbwrapper_basic_data)
{
    // Perform tests both obfuscated and non-obfuscated.
    for (bool obfuscate : {false, true}) {
        fs::path ph = m_args.GetDataDirBase() / (obfuscate ? "dbwrapper_1_obfuscate_true" : "dbwrapper_1_obfuscate_false");
        CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20, .memory_only = false, .wipe_data = true, .obfuscate = obfuscate});

        uint256 res;
        uint32_t res_uint_32;
        bool res_bool;

        // Ensure that we're doing real obfuscation when obfuscate=true
        BOOST_CHECK(obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw)));

        //Simulate block raw data - "b + block hash"
        std::string key_block = "b" + m_rng.rand256().ToString();

        uint256 in_block = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_block, in_block));
        BOOST_CHECK(dbw.Read(key_block, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_block.ToString());

        //Simulate file raw data - "f + file_number"
        std::string key_file = strprintf("f%04x", m_rng.rand32());

        uint256 in_file_info = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_file, in_file_info));
        BOOST_CHECK(dbw.Read(key_file, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_file_info.ToString());

        //Simulate transaction raw data - "t + transaction hash"
        std::string key_transaction = "t" + m_rng.rand256().ToString();

        uint256 in_transaction = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_transaction, in_transaction));
        BOOST_CHECK(dbw.Read(key_transaction, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_transaction.ToString());

        //Simulate UTXO raw data - "c + transaction hash"
        std::string key_utxo = "c" + m_rng.rand256().ToString();

        uint256 in_utxo = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_utxo, in_utxo));
        BOOST_CHECK(dbw.Read(key_utxo, res));
        BOOST_CHECK_EQUAL(res.ToString(), in_utxo.ToString());

        //Simulate last block file number - "l"
        uint8_t key_last_blockfile_number{'l'};
        uint32_t lastblockfilenumber = m_rng.rand32();
        BOOST_CHECK(dbw.Write(key_last_blockfile_number, lastblockfilenumber));
        BOOST_CHECK(dbw.Read(key_last_blockfile_number, res_uint_32));
        BOOST_CHECK_EQUAL(lastblockfilenumber, res_uint_32);

        //Simulate Is Reindexing - "R"
        uint8_t key_IsReindexing{'R'};
        bool isInReindexing = m_rng.randbool();
        BOOST_CHECK(dbw.Write(key_IsReindexing, isInReindexing));
        BOOST_CHECK(dbw.Read(key_IsReindexing, res_bool));
        BOOST_CHECK_EQUAL(isInReindexing, res_bool);

        //Simulate last block hash up to which UXTO covers - 'B'
        uint8_t key_lastblockhash_uxto{'B'};
        uint256 lastblock_hash = m_rng.rand256();
        BOOST_CHECK(dbw.Write(key_lastblockhash_uxto, lastblock_hash));
        BOOST_CHECK(dbw.Read(key_lastblockhash_uxto, res));
        BOOST_CHECK_EQUAL(lastblock_hash, res);

        //Simulate file raw data - "F + filename_number + filename"
        std::string file_option_tag = "F";
        uint8_t filename_length = m_rng.randbits(8);
        std::string filename = "randomfilename";
        std::string key_file_option = strprintf("%s%01x%s", file_option_tag,filename_length,filename);

        bool in_file_bool = m_rng.randbool();
        BOOST_CHECK(dbw.Write(key_file_option, in_file_bool));
        BOOST_CHECK(dbw.Read(key_file_option, res_bool));
        BOOST_CHECK_EQUAL(res_bool, in_file_bool);
   }
}